

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  uv_signal_t *puVar1;
  uv_signal_t *first_handle;
  undefined1 local_a8 [4];
  int err;
  sigset_t saved_sigmask;
  int oneshot_local;
  int signum_local;
  uv_signal_cb signal_cb_local;
  uv_signal_t *handle_local;
  
  saved_sigmask.__val[0xf]._0_4_ = oneshot;
  saved_sigmask.__val[0xf]._4_4_ = signum;
  if ((handle->flags & 3) == 0) {
    if (signum == 0) {
      handle_local._4_4_ = -0x16;
    }
    else if (signum == handle->signum) {
      handle->signal_cb = signal_cb;
      handle_local._4_4_ = 0;
    }
    else {
      if (handle->signum != 0) {
        uv__signal_stop(handle);
      }
      uv__signal_block_and_lock((sigset_t *)local_a8);
      puVar1 = uv__signal_first_handle(saved_sigmask.__val[0xf]._4_4_);
      if (((puVar1 == (uv_signal_t *)0x0) ||
          (((int)saved_sigmask.__val[0xf] == 0 && ((puVar1->flags & 0x2000000) != 0)))) &&
         (handle_local._4_4_ =
               uv__signal_register_handler
                         (saved_sigmask.__val[0xf]._4_4_,(int)saved_sigmask.__val[0xf]),
         handle_local._4_4_ != 0)) {
        uv__signal_unlock_and_unblock((sigset_t *)local_a8);
      }
      else {
        handle->signum = saved_sigmask.__val[0xf]._4_4_;
        if ((int)saved_sigmask.__val[0xf] != 0) {
          handle->flags = handle->flags | 0x2000000;
        }
        uv__signal_tree_s_RB_INSERT(&uv__signal_tree,handle);
        uv__signal_unlock_and_unblock((sigset_t *)local_a8);
        handle->signal_cb = signal_cb;
        if (((handle->flags & 4) == 0) &&
           (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles + 1;
        }
        handle_local._4_4_ = 0;
      }
    }
    return handle_local._4_4_;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                ,0x168,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}